

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpsocketengine.cpp
# Opt level: O0

void __thiscall QHttpSocketEnginePrivate::QHttpSocketEnginePrivate(QHttpSocketEnginePrivate *this)

{
  QAbstractSocketEnginePrivate *in_RDI;
  
  QAbstractSocketEnginePrivate::QAbstractSocketEnginePrivate(in_RDI);
  *(undefined ***)in_RDI = &PTR__QHttpSocketEnginePrivate_0049f320;
  QNetworkProxy::QNetworkProxy((QNetworkProxy *)0x33ba3b);
  QString::QString((QString *)0x33ba4c);
  QAuthenticator::QAuthenticator((QAuthenticator *)&in_RDI[1].field_0x38);
  in_RDI[1].field_0x40 = 0;
  in_RDI[1].field_0x41 = 0;
  in_RDI[1].field_0x42 = 0;
  in_RDI[1].field_0x43 = 0;
  in_RDI[1].field_0x44 = 0;
  in_RDI[1].field_0x45 = 0;
  in_RDI[1].field_0x46 = 0;
  *(undefined4 *)&in_RDI[1].field_0x48 = 0;
  *(undefined8 *)&in_RDI[1].field_0x20 = 0;
  *(undefined8 *)&in_RDI[1].field_0x28 = 0;
  *(undefined4 *)&in_RDI[1].field_0x30 = 0;
  return;
}

Assistant:

QHttpSocketEnginePrivate::QHttpSocketEnginePrivate()
    : readNotificationEnabled(false)
    , writeNotificationEnabled(false)
    , exceptNotificationEnabled(false)
    , readNotificationPending(false)
    , writeNotificationPending(false)
    , connectionNotificationPending(false)
    , credentialsSent(false)
    , pendingResponseData(0)
{
    socket = nullptr;
    reply = nullptr;
    state = QHttpSocketEngine::None;
}